

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int cat(int argc,char **argv)

{
  int iVar1;
  ulonglong uVar2;
  long lVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  undefined8 uVar7;
  FILE *pFVar8;
  zip_error_t error;
  char buf [8192];
  
  uVar2 = strtoull(*argv,(char **)0x0,10);
  lVar3 = zip_fopen_index(za,uVar2,0);
  pFVar8 = _stderr;
  if (lVar3 == 0) {
    uVar7 = zip_strerror(za);
    pcVar6 = "can\'t open file at index \'%lu\': %s\n";
LAB_00104c1e:
    fprintf(pFVar8,pcVar6,uVar2,uVar7);
  }
  else {
    do {
      sVar4 = zip_fread(lVar3,buf,0x2000);
      pFVar8 = _stderr;
      if ((long)sVar4 < 1) {
        if (sVar4 == 0xffffffffffffffff) {
          uVar7 = zip_file_strerror(lVar3);
          fprintf(pFVar8,"can\'t read file at index \'%lu\': %s\n",uVar2,uVar7);
          zip_fclose(lVar3);
          return -1;
        }
        iVar1 = zip_fclose(lVar3);
        if (iVar1 == 0) {
          return 0;
        }
        zip_error_init_with_code(&error);
        pFVar8 = _stderr;
        uVar7 = zip_error_strerror(&error);
        pcVar6 = "can\'t close file at index \'%lu\': %s\n";
        goto LAB_00104c1e;
      }
      sVar4 = fwrite(buf,sVar4,1,_stdout);
    } while (sVar4 == 1);
    zip_fclose(lVar3);
    pFVar8 = _stderr;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(pFVar8,"can\'t write file contents to stdout: %s\n",pcVar6);
  }
  return -1;
}

Assistant:

static int
cat(int argc, char *argv[]) {
    /* output file contents to stdout */
    zip_uint64_t idx;
    zip_int64_t n;
    zip_file_t *zf;
    char buf[8192];
    int err;
    idx = strtoull(argv[0], NULL, 10);

#ifdef _WIN32
    /* Need to set stdout to binary mode for Windows */
    setmode(fileno(stdout), _O_BINARY);
#endif
    if ((zf = zip_fopen_index(za, idx, 0)) == NULL) {
	fprintf(stderr, "can't open file at index '%" PRIu64 "': %s\n", idx, zip_strerror(za));
	return -1;
    }
    while ((n = zip_fread(zf, buf, sizeof(buf))) > 0) {
	if (fwrite(buf, (size_t)n, 1, stdout) != 1) {
	    zip_fclose(zf);
	    fprintf(stderr, "can't write file contents to stdout: %s\n", strerror(errno));
	    return -1;
	}
    }
    if (n == -1) {
	fprintf(stderr, "can't read file at index '%" PRIu64 "': %s\n", idx, zip_file_strerror(zf));
	zip_fclose(zf);
	return -1;
    }
    if ((err = zip_fclose(zf)) != 0) {
	zip_error_t error;

	zip_error_init_with_code(&error, err);
	fprintf(stderr, "can't close file at index '%" PRIu64 "': %s\n", idx, zip_error_strerror(&error));
	return -1;
    }

    return 0;
}